

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void corruptSchema(InitData *pData,char **azObj,char *zExtra)

{
  sqlite3 *db_00;
  int iVar1;
  char *pcVar2;
  char *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  char *zObj;
  char *z;
  sqlite3 *db;
  char *local_38;
  char *local_28;
  
  db_00 = (sqlite3 *)*in_RDI;
  if (db_00->mallocFailed == '\0') {
    if (*(long *)in_RDI[1] == 0) {
      if ((*(uint *)(in_RDI + 3) & 3) == 0) {
        if ((db_00->flags & 1) == 0) {
          if (in_RSI[1] == 0) {
            local_38 = "?";
          }
          else {
            local_38 = (char *)in_RSI[1];
          }
          local_28 = sqlite3MPrintf(db_00,"malformed database schema (%s)",local_38);
          if ((in_RDX != (char *)0x0) && (*in_RDX != '\0')) {
            local_28 = sqlite3MPrintf(db_00,"%z - %s",local_28,in_RDX);
          }
          *(char **)in_RDI[1] = local_28;
          iVar1 = sqlite3CorruptError(0);
          *(int *)((long)in_RDI + 0x14) = iVar1;
        }
        else {
          iVar1 = sqlite3CorruptError(0);
          *(int *)((long)in_RDI + 0x14) = iVar1;
        }
      }
      else {
        pcVar2 = sqlite3MPrintf(db_00,"error in %s %s after %s: %s",*in_RSI,in_RSI[1],
                                corruptSchema::azAlterType[(*(uint *)(in_RDI + 3) & 3) - 1],in_RDX);
        *(char **)in_RDI[1] = pcVar2;
        *(undefined4 *)((long)in_RDI + 0x14) = 1;
      }
    }
  }
  else {
    *(undefined4 *)((long)in_RDI + 0x14) = 7;
  }
  return;
}

Assistant:

static void corruptSchema(
  InitData *pData,     /* Initialization context */
  char **azObj,        /* Type and name of object being parsed */
  const char *zExtra   /* Error information */
){
  sqlite3 *db = pData->db;
  if( db->mallocFailed ){
    pData->rc = SQLITE_NOMEM_BKPT;
  }else if( pData->pzErrMsg[0]!=0 ){
    /* A error message has already been generated.  Do not overwrite it */
  }else if( pData->mInitFlags & (INITFLAG_AlterMask) ){
    static const char *azAlterType[] = {
       "rename",
       "drop column",
       "add column"
    };
    *pData->pzErrMsg = sqlite3MPrintf(db,
        "error in %s %s after %s: %s", azObj[0], azObj[1],
        azAlterType[(pData->mInitFlags&INITFLAG_AlterMask)-1],
        zExtra
    );
    pData->rc = SQLITE_ERROR;
  }else if( db->flags & SQLITE_WriteSchema ){
    pData->rc = SQLITE_CORRUPT_BKPT;
  }else{
    char *z;
    const char *zObj = azObj[1] ? azObj[1] : "?";
    z = sqlite3MPrintf(db, "malformed database schema (%s)", zObj);
    if( zExtra && zExtra[0] ) z = sqlite3MPrintf(db, "%z - %s", z, zExtra);
    *pData->pzErrMsg = z;
    pData->rc = SQLITE_CORRUPT_BKPT;
  }
}